

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_memory_util.cpp
# Opt level: O3

void * onmemdup(void *src,size_t sz)

{
  void *pvVar1;
  
  if (sz != 0 && src != (void *)0x0) {
    pvVar1 = onmalloc(sz);
    if (pvVar1 != (void *)0x0) {
      pvVar1 = memcpy(pvVar1,src,sz);
      return pvVar1;
    }
  }
  return (void *)0x0;
}

Assistant:

void* onmemdup( const void* src, size_t sz )
{
  void* p;
  if ( src && sz>0 ) 
  {
    p = onmalloc(sz);
    if (p)
      memcpy(p,src,sz);
  }
  else {
    p = 0;
  }
  return p;
}